

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

interval<unsigned_long> __thiscall
slang::IntervalMapDetails::
NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
::getBounds(NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
            *this,uint32_t size)

{
  ulong uVar1;
  ulong uVar2;
  LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false> *self;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
  *pNVar3;
  interval<unsigned_long> iVar4;
  
  uVar1 = *(ulong *)(this + 8);
  pNVar3 = this + 0x18;
  for (uVar2 = 1; uVar2 < size; uVar2 = uVar2 + 1) {
    if (uVar1 <= *(ulong *)pNVar3) {
      uVar1 = *(ulong *)pNVar3;
    }
    pNVar3 = pNVar3 + 0x10;
  }
  iVar4.right = uVar1;
  iVar4.left = *(unsigned_long *)this;
  return iVar4;
}

Assistant:

interval<TKey> getBounds(uint32_t size) const {
        SLANG_ASSERT(size);
        auto& self = *static_cast<const TDerived*>(this);
        auto result = self.keyAt(0);
        for (uint32_t i = 1; i < size; i++)
            result.right = std::max(result.right, self.keyAt(i).right);
        return result;
    }